

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteInvalidModule
          (BinaryWriterSpec *this,ScriptModule *module,string_view text)

{
  ScriptModuleType SVar1;
  int iVar2;
  undefined4 extraout_var;
  Stream *pSVar3;
  char *pcVar4;
  size_type extraout_RDX;
  string_view filename_00;
  string_view s;
  string_view sVar5;
  undefined1 local_80 [8];
  string filename;
  char *local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  filename.field_2._8_8_ = text.size_;
  SVar1 = module->type_;
  if (SVar1 == Quoted) {
    local_50 = "text";
    pcVar4 = kWatExtension;
  }
  else if ((SVar1 == Binary) || (SVar1 == Text)) {
    local_50 = "binary";
    pcVar4 = kWasmExtension;
  }
  else {
    pcVar4 = "";
    local_50 = "";
  }
  iVar2 = (*module->_vptr_ScriptModule[2])(module);
  Stream::Writef(this->json_stream_,"\"%s\": ","line");
  Stream::Writef(this->json_stream_,"%d",(ulong)*(uint *)(CONCAT44(extraout_var,iVar2) + 0x10));
  Stream::Writef(this->json_stream_,", ");
  (anonymous_namespace)::BinaryWriterSpec::GetModuleFilename_abi_cxx11_
            ((string *)local_80,this,pcVar4);
  Stream::Writef(this->json_stream_,"\"%s\": ","filename");
  filename_00.size_ = extraout_RDX;
  filename_00.data_ = filename._M_dataplus._M_p;
  sVar5 = GetBasename((wabt *)local_80,filename_00);
  WriteEscapedString(this,sVar5);
  Stream::Writef(this->json_stream_,", ");
  Stream::Writef(this->json_stream_,"\"%s\": ","text");
  s.size_ = filename.field_2._8_8_;
  s.data_ = text.data_;
  WriteEscapedString(this,s);
  Stream::Writef(this->json_stream_,", ");
  Stream::Writef(this->json_stream_,"\"%s\": ","module_type");
  Stream::Writef(this->json_stream_,"\"%s\"",local_50);
  sVar5.size_ = (size_type)filename._M_dataplus._M_p;
  sVar5.data_ = (char *)local_80;
  SVar1 = module->type_;
  if (SVar1 == Quoted) {
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_80;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)filename._M_dataplus._M_p;
    if ((this->module_stream_factory_).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_00f42d60:
      std::__throw_bad_function_call();
    }
    pSVar3 = (*(this->module_stream_factory_)._M_invoker)
                       ((_Any_data *)&this->module_stream_factory_,(string_view *)&local_48);
    if (module->type_ != Quoted) {
      pcVar4 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::DataScriptModule<wabt::ScriptModuleType::Quoted>, Base = wabt::ScriptModule]"
      ;
LAB_00f42d91:
      __assert_fail("isa<Derived>(base)",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/cast.h"
                    ,0x48,pcVar4);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_48,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(module + 5));
    if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      Stream::WriteData(pSVar3,local_48.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_48.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,"",No);
    }
  }
  else {
    if (SVar1 != Binary) {
      if (SVar1 == Text) {
        WriteModule(this,sVar5,(Module *)(module + 1));
      }
      goto LAB_00f42d3f;
    }
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_80;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)filename._M_dataplus._M_p;
    if ((this->module_stream_factory_).super__Function_base._M_manager == (_Manager_type)0x0)
    goto LAB_00f42d60;
    pSVar3 = (*(this->module_stream_factory_)._M_invoker)
                       ((_Any_data *)&this->module_stream_factory_,(string_view *)&local_48);
    if (module->type_ != Binary) {
      pcVar4 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::DataScriptModule<wabt::ScriptModuleType::Binary>, Base = wabt::ScriptModule]"
      ;
      goto LAB_00f42d91;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_48,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(module + 5));
    if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      Stream::WriteData(pSVar3,local_48.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_48.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,"",No);
    }
  }
  if ((wabt *)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (wabt *)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
LAB_00f42d3f:
  if (local_80 != (undefined1  [8])&filename._M_string_length) {
    operator_delete((void *)local_80);
  }
  return;
}

Assistant:

void BinaryWriterSpec::WriteInvalidModule(const ScriptModule& module,
                                          string_view text) {
  const char* extension = "";
  const char* module_type = "";
  switch (module.type()) {
    case ScriptModuleType::Text:
      extension = kWasmExtension;
      module_type = "binary";
      break;

    case ScriptModuleType::Binary:
      extension = kWasmExtension;
      module_type = "binary";
      break;

    case ScriptModuleType::Quoted:
      extension = kWatExtension;
      module_type = "text";
      break;
  }

  WriteLocation(module.location());
  WriteSeparator();
  std::string filename = GetModuleFilename(extension);
  WriteKey("filename");
  WriteEscapedString(GetBasename(filename));
  WriteSeparator();
  WriteKey("text");
  WriteEscapedString(text);
  WriteSeparator();
  WriteKey("module_type");
  WriteString(module_type);
  WriteScriptModule(filename, module);
}